

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

int do_insmod_inner(int nargs,char **args,int opt_len)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  ulong uVar5;
  char *__dest;
  ulong uStack_40;
  char acStack_38 [12];
  uint local_2c [2];
  uint size;
  
  uVar5 = (ulong)(opt_len + 1) + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar5;
  __dest = acStack_38 + lVar2;
  acStack_38[-uVar5] = '\0';
  if (2 < nargs) {
    pcVar1 = args[2];
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1049db;
    strcpy(__dest,pcVar1);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 3;
    for (uVar5 = *(ulong *)((long)&uStack_40 + lVar2); (uint)nargs != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1049ef;
      sVar4 = strlen(__dest);
      (__dest + sVar4)[0] = ' ';
      (__dest + sVar4)[1] = '\0';
      pcVar1 = args[uVar5];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a01;
      strcat(__dest,pcVar1);
    }
  }
  pcVar1 = args[1];
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a13;
  __ptr = read_file(pcVar1,local_2c);
  if (__ptr == (void *)0x0) {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0xffffffffffffffff;
    iVar3 = (int)*(undefined8 *)((long)&uStack_40 + lVar2);
  }
  else {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a29;
    iVar3 = init_module(__ptr,local_2c[0],__dest);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a33;
    free(__ptr);
  }
  return iVar3;
}

Assistant:

static int do_insmod_inner(int nargs, char **args, int opt_len)
{
    char options[opt_len + 1];
    int i;

    options[0] = '\0';
    if (nargs > 2) {
        strcpy(options, args[2]);
        for (i = 3; i < nargs; ++i) {
            strcat(options, " ");
            strcat(options, args[i]);
        }
    }

    return insmod(args[1], options);
}